

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void train(int argc,char **argv)

{
  FastText fasttext;
  shared_ptr<fasttext::Args> a;
  char **in_stack_00000230;
  int in_stack_0000023c;
  Args *in_stack_00000240;
  shared_ptr<fasttext::Args> *in_stack_000002a8;
  FastText *in_stack_000002b0;
  shared_ptr<fasttext::Dictionary> *psVar1;
  FastText *in_stack_ffffffffffffff50;
  FastText *this;
  FastText local_a0;
  
  std::make_shared<fasttext::Args>();
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1606b2);
  ::fasttext::Args::parseArgs(in_stack_00000240,in_stack_0000023c,in_stack_00000230);
  psVar1 = &local_a0.dict_;
  ::fasttext::FastText::FastText(in_stack_ffffffffffffff50);
  this = &local_a0;
  std::shared_ptr<fasttext::Args>::shared_ptr(&this->args_,(shared_ptr<fasttext::Args> *)psVar1);
  ::fasttext::FastText::train(in_stack_000002b0,in_stack_000002a8);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x16070a);
  ::fasttext::FastText::~FastText(this);
  std::shared_ptr<fasttext::Args>::~shared_ptr((shared_ptr<fasttext::Args> *)0x160721);
  return;
}

Assistant:

void train(int argc, char** argv) {
  std::shared_ptr<Args> a = std::make_shared<Args>();
  a->parseArgs(argc, argv);
  FastText fasttext;
  fasttext.train(a);
}